

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramFunctor,unsigned_short,duckdb::DefaultMapType<std::map<unsigned_short,unsigned_long,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  long *plVar1;
  ulong uVar2;
  map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
  *this;
  mapped_type *pmVar3;
  ulong uVar4;
  idx_t i;
  ulong uVar5;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  long *local_c0;
  long local_b8;
  long local_b0;
  long *local_78;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
    uVar4 = uVar5;
    if (*local_c0 != 0) {
      uVar4 = (ulong)*(uint *)(*local_c0 + uVar5 * 4);
    }
    if ((local_b0 == 0) || ((*(ulong *)(local_b0 + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0)) {
      uVar2 = uVar5;
      if (*local_78 != 0) {
        uVar2 = (ulong)*(uint *)(*local_78 + uVar5 * 4);
      }
      plVar1 = *(long **)(local_70 + uVar2 * 8);
      this = (map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
              *)*plVar1;
      if (this == (map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
                   *)0x0) {
        this = DefaultMapType<std::map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>_>
               ::CreateEmpty(aggr_input->allocator);
        *plVar1 = (long)this;
      }
      pmVar3 = std::
               map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
               ::operator[](this,(key_type_conflict3 *)(local_b8 + uVar4 * 2));
      *pmVar3 = *pmVar3 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}